

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O0

void __thiscall dlib::timer<dlib::text_field>::stop(timer<dlib::text_field> *this)

{
  element_type *this_00;
  char *in_RDI;
  
  std::__shared_ptr_access<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x454a0f);
  mutex::lock((mutex *)0x454a1e);
  in_RDI[0x91] = '\0';
  this_00 = std::
            __shared_ptr_access<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x454a36);
  timer_global_clock::remove(this_00,in_RDI);
  std::__shared_ptr_access<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x454a54);
  mutex::unlock((mutex *)0x454a63);
  return;
}

Assistant:

void timer<T>::
    stop (
    )
    {
        gc->m.lock();
        running = false;
        gc->remove(this);
        gc->m.unlock();
    }